

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O1

void __thiscall MyClass::MyClass(MyClass *this)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"TESTPROXY","");
  liblogger::ProxyLogger::ProxyLogger(&this->super_ProxyLogger,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

MyClass() :
            ProxyLogger("TESTPROXY")
        {

        }